

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManStop(Fx_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  int *piVar1;
  Hsh_VecMan_t *__ptr_01;
  Vec_Flt_t *__ptr_02;
  float *__ptr_03;
  Vec_Que_t *__ptr_04;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  __ptr = p->vLits;
  iVar2 = __ptr->nCap;
  pVVar3 = __ptr->pArray;
  if (iVar2 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_002c9b6d;
  }
  else {
    lVar5 = 8;
    lVar4 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar3->nCap + lVar5);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar3 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar3->nCap + lVar5) = 0;
        iVar2 = __ptr->nCap;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < iVar2);
  }
  free(pVVar3);
LAB_002c9b6d:
  free(__ptr);
  pVVar3 = p->vCounts;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  __ptr_01 = p->pHash;
  pVVar3 = __ptr_01->vTable;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = __ptr_01->vData;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = __ptr_01->vMap;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  free(__ptr_01);
  __ptr_02 = p->vWeights;
  __ptr_03 = __ptr_02->pArray;
  if (__ptr_03 != (float *)0x0) {
    free(__ptr_03);
  }
  free(__ptr_02);
  __ptr_04 = p->vPrio;
  if (__ptr_04->pOrder != (int *)0x0) {
    free(__ptr_04->pOrder);
    __ptr_04->pOrder = (int *)0x0;
  }
  if (__ptr_04->pHeap != (int *)0x0) {
    free(__ptr_04->pHeap);
  }
  free(__ptr_04);
  pVVar3 = p->vVarCube;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vLevels;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vCubesS;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vCubesD;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vCompls;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vCubeFree;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vDiv;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vSCC;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  free(p);
  return;
}

Assistant:

void Fx_ManStop( Fx_Man_t * p )
{
//    Vec_WecFree( p->vCubes );
    Vec_WecFree( p->vLits );
    Vec_IntFree( p->vCounts );
    Hsh_VecManStop( p->pHash );
    Vec_FltFree( p->vWeights );
    Vec_QueFree( p->vPrio );
    Vec_IntFree( p->vVarCube );
    Vec_IntFree( p->vLevels );
    // temporary data
    Vec_IntFree( p->vCubesS );
    Vec_IntFree( p->vCubesD );
    Vec_IntFree( p->vCompls );
    Vec_IntFree( p->vCubeFree );
    Vec_IntFree( p->vDiv );
    Vec_IntFree( p->vSCC );
    ABC_FREE( p );
}